

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O0

void __thiscall CGL::DrawRend::scroll_event(DrawRend *this,float offset_x,float offset_y)

{
  float *pfVar1;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float scale;
  float offset_y_local;
  float offset_x_local;
  DrawRend *this_local;
  
  if ((((offset_x != 0.0) || (NAN(offset_x))) || (offset_y != 0.0)) || (NAN(offset_y))) {
    local_1c = (offset_x + offset_y) * 0.05 + 1.0;
    local_20 = 1.5;
    local_24 = 0.5;
    local_18 = offset_y;
    scale = offset_x;
    _offset_y_local = this;
    pfVar1 = std::max<float>(&local_24,&local_1c);
    pfVar1 = std::min<float>(&local_20,pfVar1);
    local_1c = *pfVar1;
    move_view(this,0.0,0.0,local_1c);
    redraw(this);
  }
  return;
}

Assistant:

void DrawRend::scroll_event( float offset_x, float offset_y ) {
  if (offset_x || offset_y) {
    float scale = 1 + 0.05 * (offset_x + offset_y);
    scale = std::min(1.5f,std::max(0.5f,scale));
    move_view(0,0,scale);
    redraw();
  }
}